

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O1

int Rsb_DecVerify(Rsb_Man_t *p,int nVars,word *f,word **g,int nGs,uint Truth4,word *pTemp1,
                 word *pTemp2)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  word *pFanins [16];
  long alStack_b8 [17];
  
  uVar9 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar9 = 1;
  }
  uVar11 = p->vFanins->nSize;
  uVar5 = (ulong)uVar11;
  uVar16 = 1 << ((byte)uVar11 & 0x1f);
  uVar13 = Truth4 >> ((byte)uVar16 & 0x1f);
  if ((int)uVar11 < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x392,"word Abc_Tt6Stretch(word, int)");
  }
  uVar14 = 1;
  if (1 < uVar11) {
    uVar14 = uVar11;
  }
  uVar10 = 2;
  if (1 < uVar11) {
    uVar10 = uVar14;
  }
  uVar14 = 3;
  if (uVar10 != 2) {
    uVar14 = uVar10;
  }
  uVar6 = 4;
  if (uVar14 != 3) {
    uVar6 = uVar14;
  }
  if (uVar6 - 4 < 3) {
    uVar15 = (uVar13 & 1) * 3;
    if (uVar5 != 0) {
      uVar15 = uVar13;
    }
    uVar15 = (uVar15 & 3) * 5;
    if (1 < uVar11) {
      uVar15 = uVar13;
    }
    uVar13 = (uVar15 & 0xf) << 4 | uVar15 & 0xf;
    if (uVar10 != 2) {
      uVar13 = uVar15;
    }
    uVar10 = (uVar13 & 0xff) << 8 | uVar13 & 0xff;
    if (uVar14 != 3) {
      uVar10 = uVar13;
    }
    uVar13 = uVar10 << 0x10 | uVar10 & 0xffff;
    if (uVar6 != 4) {
      uVar13 = uVar10;
    }
    if (uVar5 != 0) {
      piVar2 = p->vFanins->pArray;
      uVar12 = 0;
      do {
        iVar1 = piVar2[uVar12];
        if (nGs <= iVar1) {
          __assert_fail("Num < nGs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/rsb/rsbDec6.c"
                        ,0x23f,
                        "int Rsb_DecVerify(Rsb_Man_t *, int, word *, word **, int, unsigned int, word *, word *)"
                       );
        }
        alStack_b8[uVar12] = (long)g[iVar1];
        uVar12 = uVar12 + 1;
      } while (uVar5 != uVar12);
    }
    uVar12 = (ulong)uVar9;
    if (0 < (int)uVar9) {
      memset(pTemp1,0,uVar12 * 8);
    }
    if (uVar11 != 0x1f) {
      uVar8 = 1;
      if (1 < (int)uVar11) {
        uVar8 = uVar5;
      }
      uVar11 = 1;
      if (1 < (int)uVar16) {
        uVar11 = uVar16;
      }
      uVar16 = 0;
      do {
        if ((uVar13 >> (uVar16 & 0x1f) & 1) != 0) {
          if (0 < (int)uVar9) {
            memset(pTemp2,0xff,uVar12 * 8);
          }
          if (uVar5 != 0) {
            uVar4 = 0;
            do {
              lVar3 = alStack_b8[uVar4];
              if ((uVar16 >> ((uint)uVar4 & 0x1f) & 1) == 0) {
                if (0 < (int)uVar9) {
                  uVar7 = 0;
                  do {
                    pTemp2[uVar7] = pTemp2[uVar7] & ~*(ulong *)(lVar3 + uVar7 * 8);
                    uVar7 = uVar7 + 1;
                  } while (uVar12 != uVar7);
                }
              }
              else if (0 < (int)uVar9) {
                uVar7 = 0;
                do {
                  pTemp2[uVar7] = pTemp2[uVar7] & *(ulong *)(lVar3 + uVar7 * 8);
                  uVar7 = uVar7 + 1;
                } while (uVar12 != uVar7);
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 != uVar8);
          }
          if (0 < (int)uVar9) {
            uVar4 = 0;
            do {
              pTemp1[uVar4] = pTemp1[uVar4] | pTemp2[uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar12 != uVar4);
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar11);
    }
    if (0 < (int)uVar9) {
      uVar5 = 0;
      do {
        if (pTemp1[uVar5] != f[uVar5]) {
          puts("Verification failed.");
          return 1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar12 != uVar5);
    }
    return 1;
  }
  __assert_fail("nVars == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                ,0x39f,"word Abc_Tt6Stretch(word, int)");
}

Assistant:

int Rsb_DecVerify( Rsb_Man_t * p, int nVars, word * f, word ** g, int nGs, unsigned Truth4, word * pTemp1, word * pTemp2 )
{
    word * pFanins[16];
    int b, m, Num, nSuppSize;
    int nWords = Abc_TtWordNum(nVars);
    Truth4 >>= (1 << Vec_IntSize(p->vFanins));
    Truth4 = (unsigned)Abc_Tt6Stretch( (word)Truth4, Vec_IntSize(p->vFanins) );
//Kit_DsdPrintFromTruth( (unsigned *)&Truth4, Vec_IntSize(p->vFanins) );
//printf( "\n" );
//    nSuppSize = Rsb_Word6SupportSize( Truth4 );
//    assert( nSuppSize == Vec_IntSize(p->vFanins) );
    nSuppSize = Vec_IntSize(p->vFanins);
    // collect the fanins
    Vec_IntForEachEntry( p->vFanins, Num, b )
    {
        assert( Num < nGs );
        pFanins[b] = g[Num];
    }
    // create the or of ands
    Abc_TtClear( pTemp1, nWords );
    for ( m = 0; m < (1<<nSuppSize); m++ )
    {
        if ( ((Truth4 >> m) & 1) == 0 )
            continue;
        Abc_TtFill( pTemp2, nWords );
        for ( b = 0; b < nSuppSize; b++ )
            if ( (m >> b) & 1 )
                Abc_TtAnd( pTemp2, pTemp2, pFanins[b], nWords, 0 );
            else
                Abc_TtSharp( pTemp2, pTemp2, pFanins[b], nWords );
        Abc_TtOr( pTemp1, pTemp1, pTemp2, nWords );
    }
    // check the function
    if ( !Abc_TtEqual( pTemp1, f, nWords ) )
        printf( "Verification failed.\n" );
//    else
//        printf( "Verification passed.\n" );
    return 1;
}